

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O1

void __thiscall
DnsStats::SubmitOPTRecord
          (DnsStats *this,uint32_t flags,uint8_t *content,uint32_t length,uint32_t *e_rcode)

{
  uint8_t uVar1;
  uint8_t uVar2;
  int iVar3;
  uint8_t *puVar4;
  ulong uVar5;
  
  RegisterEdnsUsage(this,flags,e_rcode);
  uVar5 = 0;
  puVar4 = (uint8_t *)0x0;
  if (length != 0) {
    puVar4 = content;
  }
  this->edns_options = puVar4;
  this->edns_options_length = length;
  if (3 < length) {
    do {
      iVar3 = (int)uVar5;
      uVar1 = content[iVar3 + 2];
      uVar2 = content[iVar3 + 3];
      SubmitRegistryNumberAndCount(this,8,(uint)CONCAT11(content[uVar5],content[iVar3 + 1]),1);
      uVar5 = (ulong)(iVar3 + (uint)CONCAT11(uVar1,uVar2) + 4);
    } while (iVar3 + (uint)CONCAT11(uVar1,uVar2) + 8 <= length);
  }
  return;
}

Assistant:

void DnsStats::SubmitOPTRecord(uint32_t flags, uint8_t * content, uint32_t length, uint32_t * e_rcode)
{
    uint32_t current_index = 0;

    RegisterEdnsUsage(flags, e_rcode);

    if (current_index < length) {
        edns_options = &content[current_index];
        edns_options_length = length - current_index;
    }
    else {
        edns_options = NULL;
        edns_options_length = 0;
    }

    /* Find the options in the payload */
    while (current_index + 4 <= length)
    {
        uint32_t o_code = (content[current_index] << 8) | content[current_index + 1];
        uint32_t o_length = (content[current_index+2] << 8) | content[current_index + 3];
        current_index += 4 + o_length;
        SubmitRegistryNumber(REGISTRY_EDNS_OPT_CODE, o_code);
    }
}